

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::LongNameHandler::simpleFormatsToModifiers
          (LongNameHandler *this,UnicodeString *simpleFormats,Field field,UErrorCode *status)

{
  UBool UVar1;
  Parameters local_148;
  SimpleModifier local_138;
  undefined1 local_c8 [8];
  SimpleFormatter compiledFormatter;
  undefined1 local_70 [8];
  UnicodeString simpleFormat;
  Form plural;
  int32_t i;
  UErrorCode *status_local;
  Field field_local;
  UnicodeString *simpleFormats_local;
  LongNameHandler *this_local;
  
  simpleFormat.fUnion._52_4_ = 0;
  while( true ) {
    if (5 < (int)simpleFormat.fUnion._52_4_) {
      return;
    }
    simpleFormat.fUnion._48_4_ = simpleFormat.fUnion._52_4_;
    anon_unknown.dwarf_12ef37::getWithPlural
              ((UnicodeString *)local_70,simpleFormats,simpleFormat.fUnion._52_4_,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      SimpleFormatter::SimpleFormatter
                ((SimpleFormatter *)local_c8,(UnicodeString *)local_70,0,1,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        Modifier::Parameters::Parameters
                  (&local_148,&this->super_ModifierStore,'\0',simpleFormat.fUnion._48_4_);
        SimpleModifier::SimpleModifier(&local_138,(SimpleFormatter *)local_c8,field,false,local_148)
        ;
        SimpleModifier::operator=
                  ((SimpleModifier *)
                   (&this->field_0x10 + (long)(int)simpleFormat.fUnion._52_4_ * 0x70),&local_138);
        SimpleModifier::~SimpleModifier(&local_138);
      }
      compiledFormatter.compiledPattern.fUnion._49_3_ = 0;
      compiledFormatter.compiledPattern.fUnion.fStackFields.fBuffer[0x17]._0_1_ = UVar1 != '\0';
      SimpleFormatter::~SimpleFormatter((SimpleFormatter *)local_c8);
    }
    else {
      compiledFormatter.compiledPattern.fUnion._48_4_ = 1;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_70);
    if (compiledFormatter.compiledPattern.fUnion._48_4_ != 0) break;
    simpleFormat.fUnion._52_4_ = simpleFormat.fUnion._52_4_ + 1;
  }
  return;
}

Assistant:

void LongNameHandler::simpleFormatsToModifiers(const UnicodeString *simpleFormats, Field field,
                                               UErrorCode &status) {
    for (int32_t i = 0; i < StandardPlural::Form::COUNT; i++) {
        StandardPlural::Form plural = static_cast<StandardPlural::Form>(i);
        UnicodeString simpleFormat = getWithPlural(simpleFormats, plural, status);
        if (U_FAILURE(status)) { return; }
        SimpleFormatter compiledFormatter(simpleFormat, 0, 1, status);
        if (U_FAILURE(status)) { return; }
        fModifiers[i] = SimpleModifier(compiledFormatter, field, false, {this, 0, plural});
    }
}